

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  undefined4 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint _h;
  _func_int *p_Var15;
  int *piVar16;
  void *pvVar17;
  Allocator *pAVar18;
  size_t sVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined8 uVar24;
  undefined8 uVar25;
  int iVar26;
  int _w;
  Layer *pLVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined1 (*pauVar34) [64];
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  undefined4 *puVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  Mat *this_01;
  long lVar55;
  long lVar56;
  long lVar57;
  ulong uVar58;
  _func_int **pp_Var59;
  long lVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  long local_150;
  long local_148;
  ParamDict pd;
  size_t local_e0;
  Allocator *local_d0;
  int local_c4;
  long local_a8;
  long local_a0;
  long local_98;
  
  pLVar27 = create_layer(0xe);
  this->flatten = pLVar27;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar26 = cpu_support_x86_f16c();
  if ((iVar26 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  p_Var15 = this->_vptr_InnerProduct_x86_avx512[-3];
  this_01 = (Mat *)(&this->field_0x130 + (long)p_Var15);
  iVar26 = *(int *)(&this->field_0xd8 + (long)p_Var15);
  _h = *(uint *)(&this->field_0xd0 + (long)p_Var15);
  uVar58 = (ulong)(int)_h;
  _w = iVar26 / (int)_h;
  this_00 = &this->weight_data_tm;
  if (opt->use_packing_layout == true) {
    if ((uVar58 & 0xf) == 0) {
      Mat::reshape((Mat *)&pd,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 4,0x40,0x10,(Allocator *)0x0);
      lVar28 = 3;
      lVar29 = 4;
      lVar31 = 5;
      lVar36 = 6;
      lVar32 = 7;
      lVar53 = 8;
      lVar46 = 9;
      lVar47 = 10;
      lVar51 = 0xb;
      lVar54 = 0xc;
      local_148 = 0xd;
      local_150 = 0xe;
      local_98 = 0xf;
      local_a0 = 2;
      local_a8 = 1;
      for (uVar38 = 0; (long)(uVar38 | 0xf) < (long)uVar58; uVar38 = uVar38 + 0x10) {
        pauVar34 = (undefined1 (*) [64])
                   ((long)(this->weight_data_tm).w * (uVar38 >> 4) * (this->weight_data_tm).elemsize
                   + (long)(this->weight_data_tm).data);
        lVar60 = (long)local_c4;
        lVar56 = local_e0 * lVar28 * lVar60;
        lVar30 = local_e0 * lVar29 * lVar60;
        lVar33 = local_e0 * lVar31 * lVar60;
        lVar35 = local_e0 * lVar36 * lVar60;
        lVar37 = local_e0 * lVar32 * lVar60;
        lVar40 = local_e0 * lVar53 * lVar60;
        lVar43 = local_e0 * lVar46 * lVar60;
        lVar49 = local_e0 * lVar47 * lVar60;
        lVar45 = local_e0 * lVar51 * lVar60;
        lVar44 = local_e0 * lVar54 * lVar60;
        lVar39 = local_e0 * local_148 * lVar60;
        lVar50 = local_e0 * local_150 * lVar60;
        lVar48 = local_e0 * local_98 * lVar60;
        lVar52 = local_e0 * local_a0 * lVar60;
        lVar55 = local_e0 * local_a8 * lVar60;
        lVar57 = local_e0 * uVar38 * lVar60;
        lVar42 = 0;
        pp_Var59 = pd._vptr_ParamDict;
        for (iVar26 = 0; iVar26 + 0xf < _w; iVar26 = iVar26 + 0x10) {
          auVar85 = *(undefined1 (*) [64])((long)pp_Var59 + lVar57);
          auVar86 = *(undefined1 (*) [64])((long)pp_Var59 + lVar55);
          auVar87 = *(undefined1 (*) [64])((long)pp_Var59 + lVar52);
          auVar88 = *(undefined1 (*) [64])((long)pp_Var59 + lVar56);
          auVar89 = *(undefined1 (*) [64])((long)pp_Var59 + lVar30);
          auVar90 = *(undefined1 (*) [64])((long)pp_Var59 + lVar33);
          auVar91 = *(undefined1 (*) [64])((long)pp_Var59 + lVar35);
          auVar92 = *(undefined1 (*) [64])((long)pp_Var59 + lVar37);
          auVar84 = *(undefined1 (*) [64])((long)pp_Var59 + lVar40);
          auVar93 = *(undefined1 (*) [64])((long)pp_Var59 + lVar43);
          auVar94 = *(undefined1 (*) [64])((long)pp_Var59 + lVar49);
          auVar95 = *(undefined1 (*) [64])((long)pp_Var59 + lVar45);
          auVar73 = *(undefined1 (*) [64])((long)pp_Var59 + lVar44);
          auVar74 = *(undefined1 (*) [64])((long)pp_Var59 + lVar39);
          auVar75 = *(undefined1 (*) [64])((long)pp_Var59 + lVar50);
          auVar76 = *(undefined1 (*) [64])((long)pp_Var59 + lVar48);
          auVar72 = vunpcklps_avx512f(auVar85,auVar86);
          auVar85 = vunpckhps_avx512f(auVar85,auVar86);
          auVar86 = vunpcklps_avx512f(auVar87,auVar88);
          auVar87 = vunpckhps_avx512f(auVar87,auVar88);
          auVar88 = vunpcklps_avx512f(auVar89,auVar90);
          auVar89 = vunpckhps_avx512f(auVar89,auVar90);
          auVar90 = vunpcklps_avx512f(auVar91,auVar92);
          auVar91 = vunpckhps_avx512f(auVar91,auVar92);
          auVar92 = vunpcklps_avx512f(auVar84,auVar93);
          auVar84 = vunpckhps_avx512f(auVar84,auVar93);
          auVar93 = vunpcklps_avx512f(auVar94,auVar95);
          auVar94 = vunpckhps_avx512f(auVar94,auVar95);
          auVar95 = vunpcklps_avx512f(auVar73,auVar74);
          auVar73 = vunpckhps_avx512f(auVar73,auVar74);
          auVar74 = vunpcklps_avx512f(auVar75,auVar76);
          auVar75 = vunpckhps_avx512f(auVar75,auVar76);
          auVar76 = vunpcklpd_avx512f(auVar72,auVar86);
          auVar86 = vunpckhpd_avx512f(auVar72,auVar86);
          auVar72 = vunpcklpd_avx512f(auVar85,auVar87);
          auVar85 = vunpckhpd_avx512f(auVar85,auVar87);
          auVar87 = vunpcklpd_avx512f(auVar88,auVar90);
          auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
          auVar90 = vunpcklpd_avx512f(auVar89,auVar91);
          auVar89 = vunpckhpd_avx512f(auVar89,auVar91);
          auVar91 = vunpcklpd_avx512f(auVar92,auVar93);
          auVar92 = vunpckhpd_avx512f(auVar92,auVar93);
          auVar93 = vunpcklpd_avx512f(auVar84,auVar94);
          auVar84 = vunpckhpd_avx512f(auVar84,auVar94);
          auVar94 = vunpcklpd_avx512f(auVar95,auVar74);
          auVar95 = vunpckhpd_avx512f(auVar95,auVar74);
          auVar74 = vunpcklpd_avx512f(auVar73,auVar75);
          auVar73 = vunpckhpd_avx512f(auVar73,auVar75);
          auVar75 = vshuff64x2_avx512f(auVar76,auVar87,0x88);
          auVar77 = vshuff64x2_avx512f(auVar91,auVar94,0x88);
          auVar78 = vshuff64x2_avx512f(auVar86,auVar88,0x88);
          auVar79 = vshuff64x2_avx512f(auVar92,auVar95,0x88);
          auVar80 = vshuff64x2_avx512f(auVar72,auVar90,0x88);
          auVar81 = vshuff64x2_avx512f(auVar93,auVar74,0x88);
          auVar82 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
          auVar83 = vshuff64x2_avx512f(auVar84,auVar73,0x88);
          auVar87 = vshuff64x2_avx512f(auVar76,auVar87,0xdd);
          auVar91 = vshuff64x2_avx512f(auVar91,auVar94,0xdd);
          auVar86 = vshuff64x2_avx512f(auVar86,auVar88,0xdd);
          auVar88 = vshuff64x2_avx512f(auVar92,auVar95,0xdd);
          auVar90 = vshuff64x2_avx512f(auVar72,auVar90,0xdd);
          auVar92 = vshuff64x2_avx512f(auVar93,auVar74,0xdd);
          auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
          auVar89 = vshuff64x2_avx512f(auVar84,auVar73,0xdd);
          auVar84 = vshuff64x2_avx512f(auVar75,auVar77,0x88);
          auVar93 = vshuff64x2_avx512f(auVar78,auVar79,0x88);
          auVar94 = vshuff64x2_avx512f(auVar80,auVar81,0x88);
          auVar95 = vshuff64x2_avx512f(auVar82,auVar83,0x88);
          auVar73 = vshuff64x2_avx512f(auVar87,auVar91,0x88);
          auVar74 = vshuff64x2_avx512f(auVar86,auVar88,0x88);
          auVar76 = vshuff64x2_avx512f(auVar90,auVar92,0x88);
          auVar72 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
          auVar75 = vshuff64x2_avx512f(auVar75,auVar77,0xdd);
          auVar77 = vshuff64x2_avx512f(auVar78,auVar79,0xdd);
          auVar78 = vshuff64x2_avx512f(auVar80,auVar81,0xdd);
          auVar79 = vshuff64x2_avx512f(auVar82,auVar83,0xdd);
          auVar87 = vshuff64x2_avx512f(auVar87,auVar91,0xdd);
          auVar86 = vshuff64x2_avx512f(auVar86,auVar88,0xdd);
          auVar88 = vshuff64x2_avx512f(auVar90,auVar92,0xdd);
          auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
          *pauVar34 = auVar84;
          pauVar34[1] = auVar93;
          pauVar34[2] = auVar94;
          pauVar34[3] = auVar95;
          pauVar34[4] = auVar73;
          pauVar34[5] = auVar74;
          pauVar34[6] = auVar76;
          pauVar34[7] = auVar72;
          pauVar34[8] = auVar75;
          pauVar34[9] = auVar77;
          pauVar34[10] = auVar78;
          pauVar34[0xb] = auVar79;
          pauVar34[0xc] = auVar87;
          pauVar34[0xd] = auVar86;
          pauVar34[0xe] = auVar88;
          pauVar34[0xf] = auVar85;
          pauVar34 = pauVar34 + 0x10;
          pp_Var59 = pp_Var59 + 8;
          lVar42 = lVar42 + 0x10;
        }
        for (; iVar26 + 7 < _w; iVar26 = iVar26 + 8) {
          auVar7 = *(undefined1 (*) [32])((long)pp_Var59 + lVar57);
          auVar8 = *(undefined1 (*) [32])((long)pp_Var59 + lVar55);
          auVar9 = *(undefined1 (*) [32])((long)pp_Var59 + lVar52);
          auVar10 = *(undefined1 (*) [32])((long)pp_Var59 + lVar56);
          auVar11 = *(undefined1 (*) [32])((long)pp_Var59 + lVar30);
          auVar12 = *(undefined1 (*) [32])((long)pp_Var59 + lVar33);
          auVar13 = *(undefined1 (*) [32])((long)pp_Var59 + lVar35);
          auVar14 = *(undefined1 (*) [32])((long)pp_Var59 + lVar37);
          auVar23 = *(undefined1 (*) [32])((long)pp_Var59 + lVar40);
          auVar71 = *(undefined1 (*) [32])((long)pp_Var59 + lVar43);
          auVar96 = *(undefined1 (*) [32])((long)pp_Var59 + lVar49);
          auVar97 = *(undefined1 (*) [32])((long)pp_Var59 + lVar45);
          auVar98 = *(undefined1 (*) [32])((long)pp_Var59 + lVar44);
          auVar6 = *(undefined1 (*) [32])((long)pp_Var59 + lVar39);
          auVar62 = *(undefined1 (*) [32])((long)pp_Var59 + lVar50);
          auVar63 = *(undefined1 (*) [32])((long)pp_Var59 + lVar48);
          auVar61 = vunpcklps_avx512vl(auVar7,auVar8);
          auVar7 = vunpckhps_avx(auVar7,auVar8);
          auVar64 = vunpcklps_avx(auVar9,auVar10);
          auVar8 = vunpckhps_avx(auVar9,auVar10);
          auVar65 = vunpcklps_avx(auVar11,auVar12);
          auVar9 = vunpckhps_avx(auVar11,auVar12);
          auVar66 = vunpcklps_avx(auVar13,auVar14);
          auVar10 = vunpckhps_avx(auVar13,auVar14);
          auVar67 = vunpcklps_avx(auVar23,auVar71);
          auVar11 = vunpckhps_avx(auVar23,auVar71);
          auVar68 = vunpcklps_avx(auVar96,auVar97);
          auVar12 = vunpckhps_avx(auVar96,auVar97);
          auVar69 = vunpcklps_avx(auVar98,auVar6);
          auVar13 = vunpckhps_avx(auVar98,auVar6);
          auVar6 = vunpcklps_avx(auVar62,auVar63);
          auVar14 = vunpckhps_avx(auVar62,auVar63);
          auVar62 = vunpcklpd_avx512vl(auVar61,auVar64);
          auVar63 = vunpckhpd_avx512vl(auVar61,auVar64);
          auVar64 = vunpcklpd_avx512vl(auVar7,auVar8);
          auVar7 = vunpckhpd_avx(auVar7,auVar8);
          auVar23 = vunpcklpd_avx(auVar65,auVar66);
          auVar8 = vunpckhpd_avx(auVar65,auVar66);
          auVar71 = vunpcklpd_avx(auVar9,auVar10);
          auVar9 = vunpckhpd_avx(auVar9,auVar10);
          auVar96 = vunpcklpd_avx(auVar67,auVar68);
          auVar10 = vunpckhpd_avx(auVar67,auVar68);
          auVar97 = vunpcklpd_avx(auVar11,auVar12);
          auVar11 = vunpckhpd_avx(auVar11,auVar12);
          auVar98 = vunpcklpd_avx(auVar69,auVar6);
          auVar12 = vunpckhpd_avx(auVar69,auVar6);
          auVar6 = vunpcklpd_avx(auVar13,auVar14);
          auVar13 = vunpckhpd_avx(auVar13,auVar14);
          auVar99._16_16_ = auVar23._0_16_;
          auVar99._0_16_ = auVar62._0_16_;
          auVar65 = vinsertf32x4_avx512vl(auVar96,auVar98._0_16_,1);
          auVar66 = vinsertf32x4_avx512vl(auVar63,auVar8._0_16_,1);
          auVar67 = vinsertf32x4_avx512vl(auVar10,auVar12._0_16_,1);
          auVar68 = vinsertf32x4_avx512vl(auVar64,auVar71._0_16_,1);
          auVar69 = vinsertf32x4_avx512vl(auVar97,auVar6._0_16_,1);
          auVar61 = vinsertf32x4_avx512vl(auVar7,auVar9._0_16_,1);
          auVar70 = vinsertf32x4_avx512vl(auVar11,auVar13._0_16_,1);
          auVar14 = vperm2f128_avx(auVar62,auVar23,0x31);
          auVar23 = vperm2f128_avx(auVar96,auVar98,0x31);
          auVar8 = vperm2f128_avx(auVar63,auVar8,0x31);
          auVar10 = vperm2f128_avx(auVar10,auVar12,0x31);
          auVar71 = vshuff64x2_avx512vl(auVar64,auVar71,3);
          auVar12 = vperm2f128_avx(auVar97,auVar6,0x31);
          auVar7 = vperm2f128_avx(auVar7,auVar9,0x31);
          auVar9 = vperm2f128_avx(auVar11,auVar13,0x31);
          *(undefined1 (*) [32])*pauVar34 = auVar99;
          *(undefined1 (*) [32])((long)*pauVar34 + 0x20) = auVar65;
          *(undefined1 (*) [32])pauVar34[1] = auVar66;
          *(undefined1 (*) [32])(pauVar34[1] + 0x20) = auVar67;
          *(undefined1 (*) [32])pauVar34[2] = auVar68;
          *(undefined1 (*) [32])(pauVar34[2] + 0x20) = auVar69;
          *(undefined1 (*) [32])pauVar34[3] = auVar61;
          *(undefined1 (*) [32])(pauVar34[3] + 0x20) = auVar70;
          *(undefined1 (*) [32])pauVar34[4] = auVar14;
          *(undefined1 (*) [32])(pauVar34[4] + 0x20) = auVar23;
          *(undefined1 (*) [32])pauVar34[5] = auVar8;
          *(undefined1 (*) [32])(pauVar34[5] + 0x20) = auVar10;
          *(undefined1 (*) [32])pauVar34[6] = auVar71;
          *(undefined1 (*) [32])(pauVar34[6] + 0x20) = auVar12;
          *(undefined1 (*) [32])pauVar34[7] = auVar7;
          *(undefined1 (*) [32])(pauVar34[7] + 0x20) = auVar9;
          pauVar34 = pauVar34 + 8;
          pp_Var59 = pp_Var59 + 4;
          lVar42 = lVar42 + 8;
        }
        lVar60 = local_e0 * lVar60;
        for (; (int)lVar42 < _w; lVar42 = lVar42 + 1) {
          puVar41 = (undefined4 *)((long)pd._vptr_ParamDict + lVar42 * 4 + lVar60 * uVar38);
          *(undefined4 *)*pauVar34 = *puVar41;
          *(undefined4 *)((long)*pauVar34 + 4) = *(undefined4 *)((long)puVar41 + lVar60);
          *(undefined4 *)((long)*pauVar34 + 8) = *(undefined4 *)((long)puVar41 + lVar60 * 2);
          *(undefined4 *)((long)*pauVar34 + 0xc) = *(undefined4 *)((long)puVar41 + lVar60 * 3);
          *(undefined4 *)((long)*pauVar34 + 0x10) = puVar41[lVar60];
          *(undefined4 *)((long)*pauVar34 + 0x14) = *(undefined4 *)((long)puVar41 + lVar60 * 5);
          *(undefined4 *)((long)*pauVar34 + 0x18) = *(undefined4 *)((long)puVar41 + lVar60 * 6);
          *(undefined4 *)((long)*pauVar34 + 0x1c) = *(undefined4 *)((long)puVar41 + lVar60 * 7);
          *(undefined4 *)((long)*pauVar34 + 0x20) = puVar41[lVar60 * 2];
          *(undefined4 *)((long)*pauVar34 + 0x24) = *(undefined4 *)((long)puVar41 + lVar60 * 9);
          *(undefined4 *)((long)*pauVar34 + 0x28) = *(undefined4 *)((long)puVar41 + lVar60 * 10);
          *(undefined4 *)((long)*pauVar34 + 0x2c) = *(undefined4 *)((long)puVar41 + lVar60 * 0xb);
          *(undefined4 *)((long)*pauVar34 + 0x30) = puVar41[lVar60 * 3];
          *(undefined4 *)((long)*pauVar34 + 0x34) = *(undefined4 *)((long)puVar41 + lVar60 * 0xd);
          *(undefined4 *)((long)*pauVar34 + 0x38) = *(undefined4 *)((long)puVar41 + lVar60 * 0xe);
          *(undefined4 *)((long)*pauVar34 + 0x3c) = *(undefined4 *)((long)puVar41 + lVar60 * 0xf);
          pauVar34 = pauVar34 + 1;
        }
        lVar28 = lVar28 + 0x10;
        lVar29 = lVar29 + 0x10;
        lVar31 = lVar31 + 0x10;
        lVar36 = lVar36 + 0x10;
        lVar32 = lVar32 + 0x10;
        lVar53 = lVar53 + 0x10;
        lVar46 = lVar46 + 0x10;
        lVar47 = lVar47 + 0x10;
        lVar51 = lVar51 + 0x10;
        lVar54 = lVar54 + 0x10;
        local_148 = local_148 + 0x10;
        local_150 = local_150 + 0x10;
        local_98 = local_98 + 0x10;
        local_a0 = local_a0 + 0x10;
        local_a8 = local_a8 + 0x10;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_0027dc64;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_0027dc64;
      if (local_d0 != (Allocator *)0x0) {
        (*local_d0->_vptr_Allocator[3])();
        goto LAB_0027dc64;
      }
    }
    else if ((_h & 7) == 0) {
      Mat::reshape((Mat *)&pd,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 3,0x20,8,(Allocator *)0x0);
      lVar28 = 1;
      lVar29 = 2;
      lVar31 = 3;
      lVar36 = 4;
      lVar32 = 5;
      lVar53 = 6;
      lVar46 = 7;
      lVar47 = 0;
      for (uVar38 = 0; (long)(uVar38 | 7) < (long)uVar58; uVar38 = uVar38 + 8) {
        pvVar17 = (this->weight_data_tm).data;
        sVar19 = (this->weight_data_tm).elemsize;
        lVar54 = (long)(this->weight_data_tm).w;
        puVar41 = (undefined4 *)((uVar38 >> 3) * lVar54 * sVar19 + (long)pvVar17);
        lVar49 = (long)local_c4;
        lVar54 = sVar19 * lVar47 * lVar54;
        lVar51 = local_e0 * uVar38 * lVar49;
        lVar60 = local_e0 * lVar28 * lVar49;
        lVar30 = local_e0 * lVar29 * lVar49;
        lVar35 = local_e0 * lVar31 * lVar49;
        lVar37 = local_e0 * lVar36 * lVar49;
        lVar40 = local_e0 * lVar32 * lVar49;
        lVar43 = local_e0 * lVar53 * lVar49;
        lVar45 = local_e0 * lVar46 * lVar49;
        lVar33 = 0;
        lVar50 = 0;
        for (iVar26 = 0; iVar26 + 0xf < _w; iVar26 = iVar26 + 0x10) {
          auVar85 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar50 + lVar51);
          auVar86 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar50 + lVar60);
          auVar87 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar50 + lVar30);
          auVar88 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar50 + lVar35);
          auVar89 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar50 + lVar37);
          auVar90 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar50 + lVar40);
          auVar91 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar50 + lVar43);
          auVar92 = *(undefined1 (*) [64])((long)pd._vptr_ParamDict + lVar50 + lVar45);
          auVar84 = vunpcklps_avx512f(auVar85,auVar86);
          auVar85 = vunpckhps_avx512f(auVar85,auVar86);
          auVar86 = vunpcklps_avx512f(auVar87,auVar88);
          auVar87 = vunpckhps_avx512f(auVar87,auVar88);
          auVar88 = vunpcklps_avx512f(auVar89,auVar90);
          auVar89 = vunpckhps_avx512f(auVar89,auVar90);
          auVar90 = vunpcklps_avx512f(auVar91,auVar92);
          auVar91 = vunpckhps_avx512f(auVar91,auVar92);
          auVar92 = vunpcklpd_avx512f(auVar84,auVar86);
          auVar86 = vunpckhpd_avx512f(auVar84,auVar86);
          auVar84 = vunpcklpd_avx512f(auVar85,auVar87);
          auVar85 = vunpckhpd_avx512f(auVar85,auVar87);
          auVar87 = vunpcklpd_avx512f(auVar88,auVar90);
          auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
          auVar90 = vunpcklpd_avx512f(auVar89,auVar91);
          auVar89 = vunpckhpd_avx512f(auVar89,auVar91);
          auVar91 = vshuff64x2_avx512f(auVar92,auVar87,0x88);
          auVar93 = vshuff64x2_avx512f(auVar86,auVar88,0x88);
          auVar94 = vshuff64x2_avx512f(auVar84,auVar90,0x88);
          auVar95 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
          auVar87 = vshuff64x2_avx512f(auVar92,auVar87,0xdd);
          auVar86 = vshuff64x2_avx512f(auVar86,auVar88,0xdd);
          auVar88 = vshuff64x2_avx512f(auVar84,auVar90,0xdd);
          auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
          auVar89 = vshuff64x2_avx512f(auVar91,auVar93,0x88);
          auVar90 = vshuff64x2_avx512f(auVar94,auVar95,0x88);
          auVar92 = vshuff64x2_avx512f(auVar87,auVar86,0x88);
          auVar84 = vshuff64x2_avx512f(auVar88,auVar85,0x88);
          auVar91 = vshuff64x2_avx512f(auVar91,auVar93,0xdd);
          auVar93 = vshuff64x2_avx512f(auVar94,auVar95,0xdd);
          auVar86 = vshuff64x2_avx512f(auVar87,auVar86,0xdd);
          auVar85 = vshuff64x2_avx512f(auVar88,auVar85,0xdd);
          *(undefined1 (*) [64])((long)pvVar17 + lVar50 * 8 + lVar54) = auVar89;
          *(undefined1 (*) [64])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x40) = auVar90;
          *(undefined1 (*) [64])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x80) = auVar92;
          *(undefined1 (*) [64])((long)pvVar17 + lVar50 * 8 + lVar54 + 0xc0) = auVar84;
          *(undefined1 (*) [64])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x100) = auVar91;
          *(undefined1 (*) [64])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x140) = auVar93;
          *(undefined1 (*) [64])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x180) = auVar86;
          *(undefined1 (*) [64])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x1c0) = auVar85;
          puVar41 = puVar41 + 0x80;
          lVar50 = lVar50 + 0x40;
          lVar33 = lVar33 + 0x10;
        }
        for (; iVar26 + 7 < _w; iVar26 = iVar26 + 8) {
          auVar7 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar50 + lVar51);
          auVar8 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar50 + lVar60);
          auVar9 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar50 + lVar30);
          auVar10 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar50 + lVar35);
          auVar11 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar50 + lVar37);
          auVar12 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar50 + lVar40);
          auVar13 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar50 + lVar43);
          auVar14 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar50 + lVar45);
          auVar23 = vunpcklps_avx(auVar7,auVar8);
          auVar8 = vunpckhps_avx(auVar7,auVar8);
          auVar7 = vunpcklps_avx(auVar9,auVar10);
          auVar9 = vunpckhps_avx(auVar9,auVar10);
          auVar71 = vunpcklps_avx(auVar11,auVar12);
          auVar10 = vunpckhps_avx(auVar11,auVar12);
          auVar96 = vunpcklps_avx(auVar13,auVar14);
          auVar11 = vunpckhps_avx(auVar13,auVar14);
          auVar12 = vunpcklpd_avx(auVar23,auVar7);
          auVar7 = vunpckhpd_avx(auVar23,auVar7);
          auVar13 = vunpcklpd_avx(auVar8,auVar9);
          auVar8 = vunpckhpd_avx(auVar8,auVar9);
          auVar14 = vunpcklpd_avx(auVar71,auVar96);
          auVar9 = vunpckhpd_avx(auVar71,auVar96);
          auVar23 = vunpcklpd_avx(auVar10,auVar11);
          auVar10 = vunpckhpd_avx(auVar10,auVar11);
          auVar71._16_16_ = auVar14._0_16_;
          auVar71._0_16_ = auVar12._0_16_;
          auVar96._16_16_ = auVar9._0_16_;
          auVar96._0_16_ = auVar7._0_16_;
          auVar97._16_16_ = auVar23._0_16_;
          auVar97._0_16_ = auVar13._0_16_;
          auVar98._16_16_ = auVar10._0_16_;
          auVar98._0_16_ = auVar8._0_16_;
          auVar11 = vperm2f128_avx(auVar12,auVar14,0x31);
          auVar7 = vperm2f128_avx(auVar7,auVar9,0x31);
          auVar9 = vperm2f128_avx(auVar13,auVar23,0x31);
          auVar8 = vperm2f128_avx(auVar8,auVar10,0x31);
          *(undefined1 (*) [32])((long)pvVar17 + lVar50 * 8 + lVar54) = auVar71;
          *(undefined1 (*) [32])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x20) = auVar96;
          *(undefined1 (*) [32])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x40) = auVar97;
          *(undefined1 (*) [32])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x60) = auVar98;
          *(undefined1 (*) [32])((long)pvVar17 + lVar50 * 8 + lVar54 + 0x80) = auVar11;
          *(undefined1 (*) [32])((long)pvVar17 + lVar50 * 8 + lVar54 + 0xa0) = auVar7;
          *(undefined1 (*) [32])((long)pvVar17 + lVar50 * 8 + lVar54 + 0xc0) = auVar9;
          *(undefined1 (*) [32])((long)pvVar17 + lVar50 * 8 + lVar54 + 0xe0) = auVar8;
          puVar41 = puVar41 + 0x40;
          lVar50 = lVar50 + 0x20;
          lVar33 = lVar33 + 8;
        }
        lVar49 = local_e0 * lVar49;
        for (; (int)lVar33 < _w; lVar33 = lVar33 + 1) {
          puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar33 * 4 + lVar49 * uVar38);
          *puVar41 = *puVar1;
          puVar41[1] = *(undefined4 *)((long)puVar1 + lVar49);
          puVar41[2] = *(undefined4 *)((long)puVar1 + lVar49 * 2);
          puVar41[3] = *(undefined4 *)((long)puVar1 + lVar49 * 3);
          puVar41[4] = puVar1[lVar49];
          puVar41[5] = *(undefined4 *)((long)puVar1 + lVar49 * 5);
          puVar41[6] = *(undefined4 *)((long)puVar1 + lVar49 * 6);
          puVar41[7] = *(undefined4 *)((long)puVar1 + lVar49 * 7);
          puVar41 = puVar41 + 8;
        }
        lVar47 = lVar47 + 1;
        lVar28 = lVar28 + 8;
        lVar29 = lVar29 + 8;
        lVar31 = lVar31 + 8;
        lVar36 = lVar36 + 8;
        lVar32 = lVar32 + 8;
        lVar53 = lVar53 + 8;
        lVar46 = lVar46 + 8;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_0027dc64;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_0027dc64;
      if (local_d0 != (Allocator *)0x0) {
        (*local_d0->_vptr_Allocator[3])();
        goto LAB_0027dc64;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_0027cbf5;
      Mat::reshape((Mat *)&pd,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 2,0x10,4,(Allocator *)0x0);
      lVar28 = 1;
      lVar29 = 2;
      lVar31 = 3;
      lVar36 = 0;
      for (uVar38 = 0; (long)(uVar38 | 3) < (long)uVar58; uVar38 = uVar38 + 4) {
        lVar46 = (long)(this->weight_data_tm).w;
        pvVar17 = (this->weight_data_tm).data;
        sVar19 = (this->weight_data_tm).elemsize;
        puVar41 = (undefined4 *)((uVar38 >> 2) * lVar46 * sVar19 + (long)pvVar17);
        lVar53 = (long)local_c4;
        lVar46 = sVar19 * lVar36 * lVar46;
        lVar47 = local_e0 * uVar38 * lVar53;
        lVar51 = local_e0 * lVar28 * lVar53;
        lVar32 = local_e0 * lVar29 * lVar53;
        lVar53 = local_e0 * lVar31 * lVar53;
        lVar60 = 0;
        lVar54 = 0;
        for (iVar26 = 0; iVar26 + 3 < _w; iVar26 = iVar26 + 4) {
          auVar2 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar54 + lVar47);
          auVar3 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar54 + lVar51);
          auVar4 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar54 + lVar32);
          auVar5 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar54 + lVar53);
          auVar21 = vunpcklps_avx(auVar2,auVar3);
          auVar22 = vunpcklps_avx(auVar4,auVar5);
          auVar20 = vunpckhps_avx(auVar2,auVar3);
          auVar5 = vunpckhps_avx(auVar4,auVar5);
          auVar2 = vmovlhps_avx(auVar21,auVar22);
          auVar4 = vunpckhpd_avx(auVar21,auVar22);
          auVar3 = vmovlhps_avx(auVar20,auVar5);
          auVar5 = vunpckhpd_avx(auVar20,auVar5);
          *(undefined1 (*) [16])((long)pvVar17 + lVar54 * 4 + lVar46) = auVar2;
          *(undefined1 (*) [16])((long)pvVar17 + lVar54 * 4 + lVar46 + 0x10) = auVar4;
          *(undefined1 (*) [16])((long)pvVar17 + lVar54 * 4 + lVar46 + 0x20) = auVar3;
          *(undefined1 (*) [16])((long)pvVar17 + lVar54 * 4 + lVar46 + 0x30) = auVar5;
          puVar41 = puVar41 + 0x10;
          lVar54 = lVar54 + 0x10;
          lVar60 = lVar60 + 4;
        }
        for (; (int)lVar60 < _w; lVar60 = lVar60 + 1) {
          *puVar41 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar60 * 4 + lVar47);
          puVar41[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar60 * 4 + lVar51);
          puVar41[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar60 * 4 + lVar32);
          puVar41[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar60 * 4 + lVar53);
          puVar41 = puVar41 + 4;
        }
        lVar36 = lVar36 + 1;
        lVar28 = lVar28 + 4;
        lVar29 = lVar29 + 4;
        lVar31 = lVar31 + 4;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_0027dc64;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_0027dc64;
      if (local_d0 != (Allocator *)0x0) {
        (*local_d0->_vptr_Allocator[3])();
        goto LAB_0027dc64;
      }
    }
    free(pd._vptr_ParamDict);
  }
  else {
LAB_0027cbf5:
    if (p_Var15 != (_func_int *)0xfffffffffffffee0) {
      piVar16 = *(int **)(&this->field_0x138 + (long)p_Var15);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      piVar16 = (this->weight_data_tm).refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          pvVar17 = (this->weight_data_tm).data;
          pAVar18 = (this->weight_data_tm).allocator;
          if (pAVar18 == (Allocator *)0x0) {
            free(pvVar17);
          }
          else {
            (*pAVar18->_vptr_Allocator[3])
                      (pAVar18,pvVar17,(long)iVar26 % (long)(int)_h & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      this_00->data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).c = 0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      piVar16 = *(int **)(&this->field_0x138 + (long)p_Var15);
      (this->weight_data_tm).data = this_01->data;
      (this->weight_data_tm).refcount = piVar16;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var15);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var15);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var15);
      uVar24 = *(undefined8 *)(&this->field_0x158 + (long)p_Var15);
      uVar25 = *(undefined8 *)(&this->field_0x160 + (long)p_Var15);
      (this->weight_data_tm).dims = (int)uVar24;
      (this->weight_data_tm).w = (int)((ulong)uVar24 >> 0x20);
      (this->weight_data_tm).h = (int)uVar25;
      (this->weight_data_tm).d = (int)((ulong)uVar25 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var15);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var15);
    }
  }
LAB_0027dc64:
  if (opt->lightmode == true) {
    p_Var15 = this->_vptr_InnerProduct_x86_avx512[-3];
    piVar16 = *(int **)(&this->field_0x138 + (long)p_Var15);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var15) == (long *)0x0) {
          free(*(void **)(&this->field_0x130 + (long)p_Var15));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var15) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var15) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var15) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var15) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var15) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var15) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var15) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var15) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var15) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}